

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O2

void __thiscall QWidgetResizeHandler::setMouseCursor(QWidgetResizeHandler *this,MousePosition m)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  QWidget *pQVar5;
  CursorShape CVar6;
  long in_FS_OFFSET;
  QCursor local_58;
  QArrayDataPointer<QObject_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(*(long *)(this + 0x10) + 8);
  local_50.d = *(Data **)(lVar1 + 0x18);
  local_50.ptr = *(QObject ***)(lVar1 + 0x20);
  uVar2 = *(ulong *)(lVar1 + 0x28);
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.size = uVar2;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    pQVar5 = (QWidget *)local_50.ptr[uVar4];
    if (((pQVar5 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0))
       && (bVar3 = QWidget::testAttribute_helper(pQVar5,WA_SetCursor), !bVar3)) {
      QCursor::QCursor(&local_58,ArrowCursor);
      QWidget::setCursor(pQVar5,&local_58);
      QCursor::~QCursor(&local_58);
    }
  }
  switch(m) {
  case TopLeft:
  case BottomRight:
    pQVar5 = *(QWidget **)(this + 0x10);
    CVar6 = SizeFDiagCursor;
    break;
  case BottomLeft:
  case TopRight:
    pQVar5 = *(QWidget **)(this + 0x10);
    CVar6 = SizeBDiagCursor;
    break;
  case Top:
  case Bottom:
    pQVar5 = *(QWidget **)(this + 0x10);
    CVar6 = SizeVerCursor;
    break;
  case Left:
  case Right:
    pQVar5 = *(QWidget **)(this + 0x10);
    CVar6 = SizeHorCursor;
    break;
  default:
    pQVar5 = *(QWidget **)(this + 0x10);
    CVar6 = ArrowCursor;
  }
  QCursor::QCursor(&local_58,CVar6);
  QWidget::setCursor(pQVar5,&local_58);
  QCursor::~QCursor(&local_58);
  QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::setMouseCursor(MousePosition m)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(m);
#else
    QObjectList children = widget->children();
    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *w = qobject_cast<QWidget*>(children.at(i))) {
            if (!w->testAttribute(Qt::WA_SetCursor)) {
                w->setCursor(Qt::ArrowCursor);
            }
        }
    }

    switch (m) {
    case TopLeft:
    case BottomRight:
        widget->setCursor(Qt::SizeFDiagCursor);
        break;
    case BottomLeft:
    case TopRight:
        widget->setCursor(Qt::SizeBDiagCursor);
        break;
    case Top:
    case Bottom:
        widget->setCursor(Qt::SizeVerCursor);
        break;
    case Left:
    case Right:
        widget->setCursor(Qt::SizeHorCursor);
        break;
    default:
        widget->setCursor(Qt::ArrowCursor);
        break;
    }
#endif // QT_NO_CURSOR
}